

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp11_zone.hpp
# Opt level: O3

void __thiscall
msgpack::v1::zone::finalizer_array::push_expand
          (finalizer_array *this,_func_void_void_ptr *func,void *data)

{
  finalizer *pfVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  
  pfVar1 = this->m_array;
  lVar4 = (long)this->m_end - (long)pfVar1;
  lVar3 = 4;
  if (lVar4 != 0) {
    lVar3 = (long)this->m_end - (long)pfVar1 >> 3;
  }
  pfVar1 = (finalizer *)realloc(pfVar1,lVar3 * 0x10);
  if (pfVar1 != (finalizer *)0x0) {
    this->m_array = pfVar1;
    this->m_end = pfVar1 + lVar3;
    *(_func_void_void_ptr **)((long)pfVar1 + lVar4) = func;
    *(void **)((long)pfVar1 + lVar4 + 8) = data;
    this->m_tail = (finalizer *)((long)pfVar1 + lVar4 + 0x10);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = dup2;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void push_expand(void (*func)(void*), void* data) {
            const size_t nused = static_cast<size_t>(m_end - m_array);
            size_t nnext;
            if(nused == 0) {
                nnext = (sizeof(finalizer) < 72/2) ?
                    72 / sizeof(finalizer) : 8;
            } else {
                nnext = nused * 2;
            }
            finalizer* tmp =
                static_cast<finalizer*>(::realloc(m_array, sizeof(finalizer) * nnext));
            if(!tmp) {
                throw std::bad_alloc();
            }
            m_array     = tmp;
            m_end   = tmp + nnext;
            m_tail  = tmp + nused;
            new (m_tail) finalizer(func, data);

            ++m_tail;
        }